

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall btConvexHullInternal::Rational128::Rational128(Rational128 *this,int64_t value)

{
  long in_RSI;
  Int128 *in_RDI;
  Int128 local_50;
  Int128 local_40;
  Int128 local_30;
  Int128 local_20;
  long local_10;
  
  local_10 = in_RSI;
  Int128::Int128(in_RDI);
  Int128::Int128(in_RDI + 1);
  if (local_10 < 1) {
    if (local_10 < 0) {
      *(undefined4 *)&in_RDI[2].low = 0xffffffff;
      Int128::Int128(&local_30,-local_10);
      in_RDI->low = local_30.low;
      in_RDI->high = local_30.high;
    }
    else {
      *(undefined4 *)&in_RDI[2].low = 0;
      Int128::Int128(&local_40,0);
      in_RDI->low = local_40.low;
      in_RDI->high = local_40.high;
    }
  }
  else {
    *(undefined4 *)&in_RDI[2].low = 1;
    Int128::Int128(&local_20,local_10);
    in_RDI->low = local_20.low;
    in_RDI->high = local_20.high;
  }
  Int128::Int128(&local_50,1);
  in_RDI[1].low = local_50.low;
  in_RDI[1].high = local_50.high;
  *(undefined1 *)((long)&in_RDI[2].low + 4) = 1;
  return;
}

Assistant:

Rational128(int64_t value)
				{
					if (value > 0)
					{
						sign = 1;
						this->numerator = value;
					}
					else if (value < 0)
					{
						sign = -1;
						this->numerator = -value;
					}
					else
					{
						sign = 0;
						this->numerator = (uint64_t) 0;
					}
					this->denominator = (uint64_t) 1;
					isInt64 = true;
				}